

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O0

MPP_RET h265d_deinit(void *ctx)

{
  HEVCContext *s_00;
  void *sc_00;
  void *pvVar1;
  h265d_dxva2_picture_context_t *ctx_pic;
  int i;
  RK_U8 *buf;
  SplitContext_t *sc;
  HEVCContext *s;
  H265dContext_t *h265dctx;
  void *ctx_local;
  
  s_00 = *ctx;
  sc_00 = *(void **)((long)ctx + 8);
  for (ctx_pic._4_4_ = 0; ctx_pic._4_4_ < 0x11; ctx_pic._4_4_ = ctx_pic._4_4_ + 1) {
    mpp_hevc_unref_frame(s_00,s_00->DPB + ctx_pic._4_4_,-1);
    mpp_frame_deinit(&s_00->DPB[ctx_pic._4_4_].frame);
  }
  for (ctx_pic._4_4_ = 0; ctx_pic._4_4_ < 0x10; ctx_pic._4_4_ = ctx_pic._4_4_ + 1) {
    if (s_00->vps_list[ctx_pic._4_4_] != (RK_U8 *)0x0) {
      mpp_mem_pool_put_f("h265d_deinit",s_00->vps_pool,s_00->vps_list[ctx_pic._4_4_]);
    }
  }
  for (ctx_pic._4_4_ = 0; ctx_pic._4_4_ < 0x10; ctx_pic._4_4_ = ctx_pic._4_4_ + 1) {
    if (s_00->sps_list[ctx_pic._4_4_] != (RK_U8 *)0x0) {
      mpp_mem_pool_put_f("h265d_deinit",s_00->sps_pool,s_00->sps_list[ctx_pic._4_4_]);
    }
  }
  for (ctx_pic._4_4_ = 0; ctx_pic._4_4_ < 0x40; ctx_pic._4_4_ = ctx_pic._4_4_ + 1) {
    mpp_hevc_pps_free(s_00->pps_list[ctx_pic._4_4_]);
  }
  mpp_osal_free("h265d_deinit",s_00->HEVClc);
  s_00->HEVClc = (HEVCLocalContext *)0x0;
  for (ctx_pic._4_4_ = 0; ctx_pic._4_4_ < s_00->nals_allocated; ctx_pic._4_4_ = ctx_pic._4_4_ + 1) {
    mpp_osal_free("h265d_deinit",s_00->nals[ctx_pic._4_4_].rbsp_buffer);
  }
  if (s_00->nals != (HEVCNAL *)0x0) {
    mpp_osal_free("h265d_deinit",s_00->nals);
  }
  if (s_00->pre_pps_data != (void *)0x0) {
    mpp_osal_free("h265d_deinit",s_00->pre_pps_data);
  }
  s_00->pre_pps_data = (void *)0x0;
  s_00->nals_allocated = 0;
  if (s_00->hal_pic_private != (void *)0x0) {
    pvVar1 = s_00->hal_pic_private;
    if (*(long *)((long)pvVar1 + 0x1e58) != 0) {
      mpp_osal_free("h265d_deinit",*(void **)((long)pvVar1 + 0x1e58));
    }
    *(undefined8 *)((long)pvVar1 + 0x1e58) = 0;
    if (*(long *)((long)pvVar1 + 0x1e70) != 0) {
      mpp_osal_free("h265d_deinit",*(void **)((long)pvVar1 + 0x1e70));
    }
    *(undefined8 *)((long)pvVar1 + 0x1e70) = 0;
    mpp_osal_free("h265d_deinit",s_00->hal_pic_private);
  }
  if (s_00->input_packet != (MppPacket)0x0) {
    pvVar1 = mpp_packet_get_data(s_00->input_packet);
    mpp_osal_free("h265d_deinit",pvVar1);
    mpp_packet_deinit(&s_00->input_packet);
  }
  if (s_00->vps_pool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("h265d_deinit",s_00->vps_pool);
  }
  if (s_00->sps_pool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("h265d_deinit",s_00->sps_pool);
  }
  if (s_00->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) {
    mpp_osal_free("h265d_deinit",s_00->hdr_dynamic_meta);
  }
  s_00->hdr_dynamic_meta = (MppFrameHdrDynamicMeta *)0x0;
  if (s_00 != (HEVCContext *)0x0) {
    mpp_osal_free("h265d_deinit",s_00);
  }
  if (sc_00 != (void *)0x0) {
    h265d_split_deinit(sc_00);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265d_deinit(void *ctx)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext       *s = h265dctx->priv_data;
    SplitContext_t *sc = h265dctx->split_cxt;
    RK_U8 *buf = NULL;
    int i;

    for (i = 0; i < MAX_DPB_SIZE; i++) {
        mpp_hevc_unref_frame(s, &s->DPB[i], ~0);
        mpp_frame_deinit(&s->DPB[i].frame);
    }

    for (i = 0; i < MAX_VPS_COUNT; i++) {
        if (s->vps_list[i])
            mpp_mem_pool_put(s->vps_pool, s->vps_list[i]);
    }
    for (i = 0; i < MAX_SPS_COUNT; i++) {
        if (s->sps_list[i])
            mpp_mem_pool_put(s->sps_pool, s->sps_list[i]);
    }
    for (i = 0; i < MAX_PPS_COUNT; i++)
        mpp_hevc_pps_free(s->pps_list[i]);

    mpp_free(s->HEVClc);

    s->HEVClc = NULL;

    for (i = 0; i < s->nals_allocated; i++)
        mpp_free(s->nals[i].rbsp_buffer);

    if (s->nals) {
        mpp_free(s->nals);
    }

    MPP_FREE(s->pre_pps_data);

    s->nals_allocated = 0;

    if (s->hal_pic_private) {
        h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)s->hal_pic_private;
        MPP_FREE(ctx_pic->slice_short);
        MPP_FREE(ctx_pic->slice_cut_param);
        mpp_free(s->hal_pic_private);
    }
    if (s->input_packet) {
        buf = mpp_packet_get_data(s->input_packet);
        mpp_free(buf);
        mpp_packet_deinit(&s->input_packet);
    }

    if (s->vps_pool)
        mpp_mem_pool_deinit(s->vps_pool);
    if (s->sps_pool)
        mpp_mem_pool_deinit(s->sps_pool);

    MPP_FREE((s->hdr_dynamic_meta));

    if (s) {
        mpp_free(s);
    }

    if (sc) {
        h265d_split_deinit(sc);
    }
    return 0;
}